

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O3

int mbedtls_mpi_lt_mpi_ct(mbedtls_mpi *X,mbedtls_mpi *Y,uint *ret)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  mbedtls_ct_condition_t mVar4;
  uint uVar5;
  ulong uVar6;
  void *p [2];
  mbedtls_mpi_uint *local_28 [2];
  
  iVar2 = -4;
  if (X->n == Y->n) {
    uVar3 = -(mbedtls_ct_zero >> 1) | -((ushort)X->s >> 1 & 1 ^ mbedtls_ct_zero);
    uVar6 = (-(mbedtls_ct_zero >> 1) | -((ushort)Y->s >> 1 & 1 ^ mbedtls_ct_zero)) ^ uVar3;
    uVar1 = (uint)(uVar3 >> 0x20);
    local_28[0] = X->p;
    local_28[1] = Y->p;
    mVar4 = mbedtls_mpi_core_lt_ct
                      (local_28[-((long)uVar3 >> 0x3f)],local_28[uVar1 >> 0x1f ^ 1],(ulong)X->n);
    iVar2 = 0;
    uVar5 = (uint)mVar4;
    if ((long)uVar6 < 0) {
      uVar5 = 0;
    }
    *ret = ((uint)(uVar6 >> 0x20) & uVar1) >> 0x1f | uVar5 & 1;
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_lt_mpi_ct(const mbedtls_mpi *X,
                          const mbedtls_mpi *Y,
                          unsigned *ret)
{
    mbedtls_ct_condition_t different_sign, X_is_negative, Y_is_negative, result;

    if (X->n != Y->n) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    /*
     * Set N_is_negative to MBEDTLS_CT_FALSE if N >= 0, MBEDTLS_CT_TRUE if N < 0.
     * We know that N->s == 1 if N >= 0 and N->s == -1 if N < 0.
     */
    X_is_negative = mbedtls_ct_bool((X->s & 2) >> 1);
    Y_is_negative = mbedtls_ct_bool((Y->s & 2) >> 1);

    /*
     * If the signs are different, then the positive operand is the bigger.
     * That is if X is negative (X_is_negative == 1), then X < Y is true and it
     * is false if X is positive (X_is_negative == 0).
     */
    different_sign = mbedtls_ct_bool_ne(X_is_negative, Y_is_negative); // true if different sign
    result = mbedtls_ct_bool_and(different_sign, X_is_negative);

    /*
     * Assuming signs are the same, compare X and Y. We switch the comparison
     * order if they are negative so that we get the right result, regardles of
     * sign.
     */

    /* This array is used to conditionally swap the pointers in const time */
    void * const p[2] = { X->p, Y->p };
    size_t i = mbedtls_ct_size_if_else_0(X_is_negative, 1);
    mbedtls_ct_condition_t lt = mbedtls_mpi_core_lt_ct((const mbedtls_mpi_uint *)p[i], (const mbedtls_mpi_uint *)p[i ^ 1], X->n);

    /*
     * Store in result iff the signs are the same (i.e., iff different_sign == false). If
     * the signs differ, result has already been set, so we don't change it.
     */
    result = mbedtls_ct_bool_or(result,
                                mbedtls_ct_bool_and(mbedtls_ct_bool_not(different_sign), lt));

    *ret = mbedtls_ct_uint_if_else_0(result, 1);

    return 0;
}